

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection_types.cpp
# Opt level: O2

string * TransportTypeAsString_abi_cxx11_
                   (string *__return_storage_ptr__,TransportProtocolType transport_type)

{
  allocator<char> *__a;
  int iVar1;
  undefined7 in_register_00000031;
  char *__s;
  long in_FS_OFFSET;
  allocator<char> local_13;
  allocator<char> local_12;
  allocator<char> local_11;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = (int)CONCAT71(in_register_00000031,transport_type);
  if (iVar1 == 2) {
    __s = "v2";
    __a = &local_13;
  }
  else if (iVar1 == 1) {
    __s = "v1";
    __a = &local_12;
  }
  else {
    if (iVar1 != 0) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/connection_types.cpp"
                    ,0x27,"std::string TransportTypeAsString(TransportProtocolType)");
    }
    __s = "detecting";
    __a = &local_11;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,__a);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::string TransportTypeAsString(TransportProtocolType transport_type)
{
    switch (transport_type) {
    case TransportProtocolType::DETECTING:
        return "detecting";
    case TransportProtocolType::V1:
        return "v1";
    case TransportProtocolType::V2:
        return "v2";
    } // no default case, so the compiler can warn about missing cases

    assert(false);
}